

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::internal::TracingMuxerImpl::ConsumerImpl::ConsumerImpl
          (ConsumerImpl *this,TracingMuxerImpl *muxer,BackendType backend_type,
          TracingBackendId backend_id,TracingSessionGlobalID session_id)

{
  TracingSessionGlobalID session_id_local;
  TracingBackendId backend_id_local;
  BackendType backend_type_local;
  TracingMuxerImpl *muxer_local;
  ConsumerImpl *this_local;
  
  Consumer::Consumer(&this->super_Consumer);
  (this->super_Consumer)._vptr_Consumer = (_func_int **)&PTR__ConsumerImpl_009c27b8;
  this->muxer_ = muxer;
  this->backend_type_ = backend_type;
  this->backend_id_ = backend_id;
  this->session_id_ = session_id;
  this->connected_ = false;
  this->start_pending_ = false;
  this->stop_pending_ = false;
  this->get_trace_stats_pending_ = false;
  this->stopped_ = false;
  std::shared_ptr<perfetto::protos::gen::TraceConfig>::shared_ptr(&this->trace_config_);
  perfetto::base::
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::ScopedResource(&this->trace_fd_,-1);
  ::std::function<void_()>::function((function<void_()> *)&this->start_complete_callback_);
  ::std::function<void_()>::function((function<void_()> *)&this->blocking_start_complete_callback_);
  std::function<void_(perfetto::TracingError)>::function(&this->error_callback_);
  ::std::function<void_()>::function((function<void_()> *)&this->stop_complete_callback_);
  ::std::function<void_()>::function((function<void_()> *)&this->blocking_stop_complete_callback_);
  std::function<void_(perfetto::TracingSession::ReadTraceCallbackArgs)>::function
            (&this->read_trace_callback_);
  std::function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)>::function
            (&this->get_trace_stats_callback_);
  std::function<void_(perfetto::TracingSession::QueryServiceStateCallbackArgs)>::function
            (&this->query_service_state_callback_);
  std::
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
  ::map(&this->data_source_states_);
  ::std::unique_ptr<perfetto::ConsumerEndpoint,std::default_delete<perfetto::ConsumerEndpoint>>::
  unique_ptr<std::default_delete<perfetto::ConsumerEndpoint>,void>
            ((unique_ptr<perfetto::ConsumerEndpoint,std::default_delete<perfetto::ConsumerEndpoint>>
              *)&this->service_);
  return;
}

Assistant:

TracingMuxerImpl::ConsumerImpl::ConsumerImpl(TracingMuxerImpl* muxer,
                                             BackendType backend_type,
                                             TracingBackendId backend_id,
                                             TracingSessionGlobalID session_id)
    : muxer_(muxer),
      backend_type_(backend_type),
      backend_id_(backend_id),
      session_id_(session_id) {}